

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

char * transform_schema2json(lys_module *module,char *expr)

{
  char *pcVar1;
  lyxp_expr *expr_00;
  lys_module *plVar2;
  size_t sVar3;
  ushort **ppuVar4;
  LY_ERR *pLVar5;
  char cVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  size_t local_58;
  
  local_58 = strlen(expr);
  local_58 = local_58 + 1;
  pcVar1 = (char *)malloc(local_58);
  if (pcVar1 == (char *)0x0) {
    pLVar5 = &ly_err_location()->no;
    if ((ly_err *)pLVar5 == (ly_err *)0x0) {
      pLVar5 = &ly_errno_int;
    }
    ((ly_err *)pLVar5)->no = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","transform_schema2json");
  }
  else {
    expr_00 = lyxp_parse_expr(expr);
    if (expr_00 != (lyxp_expr *)0x0) {
      if (expr_00->used == 0) {
        lVar13 = 0;
      }
      else {
        uVar8 = 0;
        lVar13 = 0;
        do {
          pcVar11 = expr_00->expr + expr_00->expr_pos[uVar8];
          if ((uVar8 != 0) &&
             (uVar7 = (int)uVar8 - 1,
             pcVar9 = expr_00->expr +
                      (ulong)expr_00->tok_len[uVar7] + (ulong)expr_00->expr_pos[uVar7],
             pcVar9 != pcVar11)) {
            strncpy(pcVar1 + lVar13,pcVar9,(long)pcVar11 - (long)pcVar9);
            lVar13 = lVar13 + ((long)pcVar11 - (long)pcVar9);
          }
          if (expr_00->tokens[uVar8] == LYXP_TOKEN_LITERAL) {
            cVar6 = *pcVar11;
            pcVar9 = pcVar11;
            if (cVar6 != ':') {
              uVar7 = (uint)expr_00->tok_len[uVar8];
              pcVar10 = pcVar11;
              do {
                bVar14 = uVar7 == 0;
                uVar7 = uVar7 - 1;
                if (cVar6 == '\0') {
                  pcVar9 = (char *)0x0;
                  break;
                }
                pcVar9 = (char *)0x0;
                if (bVar14) break;
                cVar6 = pcVar10[1];
                pcVar10 = pcVar10 + 1;
                pcVar9 = pcVar10;
              } while (cVar6 != ':');
            }
            if (pcVar9 != (char *)0x0) {
              ppuVar4 = __ctype_b_loc();
              lVar12 = 0;
              while ((((*ppuVar4)[pcVar9[lVar12 + -1]] & 8) != 0 ||
                     ((uVar7 = (byte)pcVar9[lVar12 + -1] - 0x2d, uVar7 < 0x33 &&
                      ((0x4000000000003U >> ((ulong)uVar7 & 0x3f) & 1) != 0))))) {
                lVar12 = lVar12 + -1;
              }
              plVar2 = lys_get_import_module(module,pcVar9 + lVar12,(int)-lVar12,(char *)0x0,0);
              if (plVar2 != (lys_module *)0x0) {
                sVar3 = strlen(plVar2->name);
                local_58 = local_58 + lVar12 + sVar3;
                pcVar10 = (char *)realloc(pcVar1,local_58);
                if (pcVar10 != (char *)0x0) {
                  strncpy(pcVar10 + lVar13,pcVar11,(size_t)(pcVar9 + (lVar12 - (long)pcVar11)));
                  strcpy(pcVar10 + (long)(pcVar9 + lVar12 + (lVar13 - (long)pcVar11)),plVar2->name);
                  sVar3 = strlen(plVar2->name);
                  strncpy(pcVar10 + (long)(pcVar9 + lVar12 + (lVar13 - (long)pcVar11)) + sVar3,
                          pcVar9,(ulong)expr_00->tok_len[uVar8] -
                                 (-lVar12 + (long)(pcVar9 + (lVar12 - (long)pcVar11))));
                  lVar13 = lVar13 + sVar3 + lVar12 + (ulong)expr_00->tok_len[uVar8];
                  pcVar1 = pcVar10;
                  goto LAB_0010f2c3;
                }
                free(pcVar1);
                pLVar5 = &ly_err_location()->no;
                if ((ly_err *)pLVar5 == (ly_err *)0x0) {
                  pLVar5 = &ly_errno_int;
                }
                ((ly_err *)pLVar5)->no = LY_EMEM;
                pcVar1 = (char *)0x0;
                ly_log(LY_LLERR,"Memory allocation failed (%s()).","transform_schema2json");
                goto LAB_0010f4d3;
              }
            }
LAB_0010f297:
            strncpy(pcVar1 + lVar13,expr_00->expr + expr_00->expr_pos[uVar8],
                    (ulong)expr_00->tok_len[uVar8]);
            lVar13 = lVar13 + (ulong)expr_00->tok_len[uVar8];
          }
          else {
            if (expr_00->tokens[uVar8] != LYXP_TOKEN_NAMETEST) goto LAB_0010f297;
            cVar6 = *pcVar11;
            pcVar9 = pcVar11;
            if (cVar6 != ':') {
              uVar7 = (uint)expr_00->tok_len[uVar8];
              pcVar10 = pcVar11;
              do {
                bVar14 = uVar7 == 0;
                uVar7 = uVar7 - 1;
                if (cVar6 == '\0') {
                  pcVar9 = (char *)0x0;
                  break;
                }
                pcVar9 = (char *)0x0;
                if (bVar14) break;
                cVar6 = pcVar10[1];
                pcVar10 = pcVar10 + 1;
                pcVar9 = pcVar10;
              } while (cVar6 != ':');
            }
            if (pcVar9 == (char *)0x0) goto LAB_0010f297;
            lVar12 = (long)pcVar9 - (long)pcVar11;
            plVar2 = lys_get_import_module(module,pcVar11,(int)lVar12,(char *)0x0,0);
            if (plVar2 == (lys_module *)0x0) {
              ly_vlog(LYE_INMOD_LEN,LY_VLOG_NONE,(void *)0x0,lVar12,pcVar11);
              goto LAB_0010f4d3;
            }
            sVar3 = strlen(plVar2->name);
            local_58 = local_58 + (sVar3 - lVar12);
            pcVar11 = (char *)realloc(pcVar1,local_58);
            if (pcVar11 == (char *)0x0) {
              free(pcVar1);
              pLVar5 = &ly_err_location()->no;
              if ((ly_err *)pLVar5 == (ly_err *)0x0) {
                pLVar5 = &ly_errno_int;
              }
              ((ly_err *)pLVar5)->no = LY_EMEM;
              pcVar1 = (char *)0x0;
              ly_log(LY_LLERR,"Memory allocation failed (%s()).","transform_schema2json");
              goto LAB_0010f4d3;
            }
            strcpy(pcVar11 + lVar13,plVar2->name);
            sVar3 = strlen(plVar2->name);
            strncpy(pcVar11 + sVar3 + lVar13,pcVar9,(ulong)expr_00->tok_len[uVar8] - lVar12);
            lVar13 = ((sVar3 + lVar13) - lVar12) + (ulong)expr_00->tok_len[uVar8];
            pcVar1 = pcVar11;
          }
LAB_0010f2c3:
          uVar8 = uVar8 + 1;
        } while (uVar8 < expr_00->used);
      }
      pcVar1[lVar13] = '\0';
      lyxp_expr_free(expr_00);
      pcVar1 = lydict_insert_zc(module->ctx,pcVar1);
      return pcVar1;
    }
LAB_0010f4d3:
    free(pcVar1);
    lyxp_expr_free(expr_00);
  }
  return (char *)0x0;
}

Assistant:

const char *
transform_schema2json(const struct lys_module *module, const char *expr)
{
    const char *end, *cur_expr, *ptr;
    char *out;
    uint16_t i;
    size_t out_size, out_used, pref_len;
    const struct lys_module *mod;
    struct lyxp_expr *exp = NULL;

    out_size = strlen(expr) + 1;
    out = malloc(out_size);
    if (!out) {
        LOGMEM;
        return NULL;
    }
    out_used = 0;

    exp = lyxp_parse_expr(expr);
    if (!exp) {
        goto error;
    }

    for (i = 0; i < exp->used; ++i) {
        cur_expr = &exp->expr[exp->expr_pos[i]];

        /* copy WS */
        if (i && ((end = exp->expr + exp->expr_pos[i - 1] + exp->tok_len[i - 1]) != cur_expr)) {
            strncpy(&out[out_used], end, cur_expr - end);
            out_used += cur_expr - end;
        }

        if ((exp->tokens[i] == LYXP_TOKEN_NAMETEST) && (end = strnchr(cur_expr, ':', exp->tok_len[i]))) {
            /* get the module */
            pref_len = end - cur_expr;
            mod = lys_get_import_module(module, cur_expr, pref_len, NULL, 0);
            if (!mod) {
                LOGVAL(LYE_INMOD_LEN, LY_VLOG_NONE, NULL, pref_len, cur_expr);
                goto error;
            }

            /* adjust out size (it can even decrease in some strange cases) */
            out_size += strlen(mod->name) - pref_len;
            out = ly_realloc(out, out_size);
            if (!out) {
                LOGMEM;
                goto error;
            }

            /* copy the model name */
            strcpy(&out[out_used], mod->name);
            out_used += strlen(mod->name);

            /* copy the rest */
            strncpy(&out[out_used], end, exp->tok_len[i] - pref_len);
            out_used += exp->tok_len[i] - pref_len;
        } else if ((exp->tokens[i] == LYXP_TOKEN_LITERAL) && (end = strnchr(cur_expr, ':', exp->tok_len[i]))) {
            ptr = end;
            while (isalnum(ptr[-1]) || (ptr[-1] == '_') || (ptr[-1] == '-') || (ptr[-1] == '.')) {
                --ptr;
            }

            /* get the module */
            pref_len = end - ptr;
            mod = lys_get_import_module(module, ptr, pref_len, NULL, 0);
            if (mod) {
                /* adjust out size (it can even decrease in some strange cases) */
                out_size += strlen(mod->name) - pref_len;
                out = ly_realloc(out, out_size);
                if (!out) {
                    LOGMEM;
                    goto error;
                }

                /* copy any beginning */
                strncpy(&out[out_used], cur_expr, ptr - cur_expr);
                out_used += ptr - cur_expr;

                /* copy the model name */
                strcpy(&out[out_used], mod->name);
                out_used += strlen(mod->name);

                /* copy the rest */
                strncpy(&out[out_used], end, (exp->tok_len[i] - pref_len) - (ptr - cur_expr));
                out_used += (exp->tok_len[i] - pref_len) - (ptr - cur_expr);
            } else {
                strncpy(&out[out_used], &exp->expr[exp->expr_pos[i]], exp->tok_len[i]);
                out_used += exp->tok_len[i];
            }
        } else {
            strncpy(&out[out_used], &exp->expr[exp->expr_pos[i]], exp->tok_len[i]);
            out_used += exp->tok_len[i];
        }
    }
    out[out_used] = '\0';

    lyxp_expr_free(exp);
    return lydict_insert_zc(module->ctx, out);

error:
    free(out);
    lyxp_expr_free(exp);
    return NULL;
}